

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

PSprite __thiscall SpriteBase::get_masked(SpriteBase *this,PSprite *mask)

{
  uint uVar1;
  _func_int ***ppp_Var2;
  _Alloc_hider _Var3;
  int iVar4;
  undefined4 extraout_var;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  ExceptionFreeserf *this_00;
  shared_ptr<Data::Sprite> *in_RDX;
  size_t x;
  long lVar8;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined1 auVar12 [16];
  PSprite PVar13;
  undefined1 local_79;
  ulong local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  SpriteBase *local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar4 = (*((in_RDX->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[1])();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar4) <=
      mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SpriteBase,std::allocator<SpriteBase>,std::shared_ptr<Data::Sprite>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length,
               (SpriteBase **)&local_50,(allocator<SpriteBase> *)&local_79,in_RDX);
    std::__shared_ptr<SpriteBase,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<SpriteBase,SpriteBase>
              ((__shared_ptr<SpriteBase,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (SpriteBase *)local_50._M_dataplus._M_p);
    local_60 = (element_type *)local_50._M_string_length;
    _Var3._M_p = local_50._M_dataplus._M_p;
    (this->super_Sprite)._vptr_Sprite = (_func_int **)local_50._M_dataplus._M_p;
    (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
    super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_50._M_string_length = 0;
    (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
    super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
    puVar5 = (uint *)(**(code **)*(_func_int **)local_50._M_dataplus._M_p)
                               (local_50._M_dataplus._M_p);
    local_70 = mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    local_68 = mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    lVar8 = (long)mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr *
            (long)local_70;
    local_78 = (**(code **)(*(_func_int **)_Var3._M_p + 8))(_Var3._M_p);
    local_58 = this;
    iVar4 = (**((in_RDX->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _vptr_Sprite)();
    puVar6 = (uint *)CONCAT44(extraout_var_00,iVar4);
    ppp_Var2 = &local_68->_vptr__Sp_counted_base;
    local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_70 - local_78);
    uVar7 = 0;
    p_Var10 = local_68;
    while( true ) {
      auVar12 = (**(code **)(*(_func_int **)_Var3._M_p + 0x10))(_Var3._M_p);
      PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           auVar12._8_8_;
      if (auVar12._0_8_ <= uVar7) break;
      uVar9 = 0;
      local_78 = uVar7;
      while( true ) {
        uVar7 = (**(code **)(*(_func_int **)_Var3._M_p + 8))(_Var3._M_p);
        if (uVar7 <= uVar9) break;
        p_Var11 = p_Var10;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)ppp_Var2 + lVar8 * 4) <= p_Var10)
        {
          p_Var11 = local_68;
        }
        uVar1 = *puVar6;
        puVar6 = puVar6 + 1;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var11->_vptr__Sp_counted_base + 4);
        *puVar5 = uVar1 & *(uint *)&p_Var11->_vptr__Sp_counted_base;
        puVar5 = puVar5 + 1;
        uVar9 = uVar9 + 1;
      }
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var10->_vptr__Sp_counted_base + (long)local_70 * 4);
      uVar7 = local_78 + 1;
    }
    PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Sprite;
    return (PSprite)PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Failed to apply mask to sprite","");
  ExceptionFreeserf::ExceptionFreeserf(this_00,&local_50);
  __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

Data::PSprite
SpriteBase::get_masked(Data::PSprite mask) {
  if (mask->get_width() > width) {
    throw ExceptionFreeserf("Failed to apply mask to sprite");
  }

  Data::PSprite masked = std::make_shared<SpriteBase>(mask);

  uint32_t *pos = reinterpret_cast<uint32_t*>(masked->get_data());

  uint32_t *s_beg = reinterpret_cast<uint32_t*>(data);
  uint32_t *s_pos = s_beg;
  uint32_t *s_end = s_beg + (width * height);
  size_t s_delta = width - masked->get_width();

  uint32_t *m_pos = reinterpret_cast<uint32_t*>(mask->get_data());

  for (size_t y = 0; y < masked->get_height(); y++) {
    for (size_t x = 0; x < masked->get_width(); x++) {
      if (s_pos >= s_end) {
        s_pos = s_beg;
      }
      *pos++ = *s_pos++ & *m_pos++;
    }
    s_pos += s_delta;
  }

  return masked;
}